

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O0

TouchPoint * __thiscall
QTuioHandler::tokenToTouchPoint(QTuioHandler *this,QTuioToken *tc,QWindow *win)

{
  bool bVar1;
  State SVar2;
  int iVar3;
  int iVar4;
  QPointF *in_RCX;
  QTuioToken *in_RDX;
  long in_RSI;
  TouchPoint *in_RDI;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  QPointF *p;
  QPointF *p1;
  QRectF *this_00;
  qreal qVar7;
  TouchPoint *tp;
  QPointF delta;
  QPointF relPos;
  TouchPoint *in_stack_fffffffffffffed0;
  QPointF *in_stack_fffffffffffffee0;
  QPointF *pQVar8;
  QPointF local_40;
  qreal local_30;
  qreal local_28;
  QPointF local_20;
  QVector2D local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(in_RDI,&DAT_00128868,0x78);
  QWindowSystemInterface::TouchPoint::TouchPoint(in_stack_fffffffffffffed0);
  iVar3 = QTuioToken::id(in_RDX);
  in_RDI->id = iVar3;
  iVar3 = QTuioToken::classId(in_RDX);
  in_RDI->uniqueId = (long)iVar3;
  in_RDI->pressure = 1.0;
  fVar5 = QTuioToken::x(in_RDX);
  fVar6 = QTuioToken::y(in_RDX);
  qVar7 = (qreal)fVar6;
  QPointF::QPointF(&local_20,(double)fVar5,qVar7);
  (in_RDI->normalPosition).xp = local_20.xp;
  (in_RDI->normalPosition).yp = local_20.yp;
  bVar1 = QTransform::isIdentity((QTransform *)0x1131ed);
  if (!bVar1) {
    local_30 = (qreal)QTransform::map((QPointF *)(in_RSI + 0x68));
    (in_RDI->normalPosition).xp = local_30;
    (in_RDI->normalPosition).yp = qVar7;
    local_28 = qVar7;
  }
  SVar2 = QTuioToken::state(in_RDX);
  in_RDI->state = SVar2;
  local_40.xp = -NAN;
  local_40.yp = -NAN;
  (**(code **)((long)in_RCX->xp + 0x70))();
  iVar3 = QSize::width((QSize *)0x113289);
  p = (QPointF *)(double)iVar3;
  qVar7 = QPointF::x(&in_RDI->normalPosition);
  p1 = (QPointF *)((double)p * qVar7);
  (**(code **)((long)in_RCX->xp + 0x70))();
  iVar3 = QSize::height((QSize *)0x1132d2);
  this_00 = (QRectF *)(double)iVar3;
  qVar7 = QPointF::y(&in_RDI->normalPosition);
  QPointF::QPointF(&local_40,(qreal)p1,(double)this_00 * qVar7);
  QPointF::toPoint(in_stack_fffffffffffffee0);
  QPointF::QPointF((QPointF *)this_00,(QPoint *)p);
  operator-(p1,(QPointF *)this_00);
  pQVar8 = in_RCX;
  QPointF::toPoint(in_RCX);
  QWindow::mapToGlobal((QPoint *)pQVar8);
  QPointF::QPointF((QPointF *)this_00,(QPoint *)p);
  operator+(p1,(QPointF *)this_00);
  QRectF::moveCenter(this_00,p);
  (**(code **)((long)in_RCX->xp + 0x70))();
  iVar3 = QSize::width((QSize *)0x11342e);
  fVar5 = QTuioToken::vx(in_RDX);
  (**(code **)((long)in_RCX->xp + 0x70))();
  iVar4 = QSize::height((QSize *)0x113475);
  fVar6 = QTuioToken::vy(in_RDX);
  QVector2D::QVector2D(&local_10,(float)iVar3 * fVar5,(float)iVar4 * fVar6);
  *&(in_RDI->velocity).v = local_10.v;
  fVar5 = QTuioToken::angle(in_RDX);
  fVar5 = qRadiansToDegrees(fVar5);
  in_RDI->rotation = (double)fVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QWindowSystemInterface::TouchPoint QTuioHandler::tokenToTouchPoint(const QTuioToken &tc, QWindow *win)
{
    QWindowSystemInterface::TouchPoint tp;
    tp.id = tc.id();
    tp.uniqueId = tc.classId(); // TODO TUIO 2.0: populate a QVariant, and register the mapping from int to arbitrary UID data
    tp.pressure = 1.0f;

    tp.normalPosition = QPointF(tc.x(), tc.y());

    if (!m_transform.isIdentity())
        tp.normalPosition = m_transform.map(tp.normalPosition);

    tp.state = tc.state();

    // We map the token position to the size of the window.
    QPointF relPos = QPointF(win->size().width() * tp.normalPosition.x(), win->size().height() * tp.normalPosition.y());
    QPointF delta = relPos - relPos.toPoint();
    tp.area.moveCenter(win->mapToGlobal(relPos.toPoint()) + delta);
    tp.velocity = QVector2D(win->size().width() * tc.vx(), win->size().height() * tc.vy());
    tp.rotation = qRadiansToDegrees(tc.angle());
    return tp;
}